

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpl_grammar.h
# Opt level: O0

void __thiscall
VPLGrammar::Parser::AssignmentExpressionNode::BuildProgram
          (AssignmentExpressionNode *this,Scope *scope,ostream *out)

{
  int iVar1;
  size_type sVar2;
  const_reference pvVar3;
  pointer pAVar4;
  string *name;
  ostream *poVar5;
  ASTTokenBasic *local_40;
  ostream *out_local;
  Scope *scope_local;
  AssignmentExpressionNode *this_local;
  
  sVar2 = std::
          vector<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>,_std::allocator<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>_>_>
          ::size(&(this->super_ASTNodeBasic).children_);
  if (sVar2 == 1) {
    pvVar3 = std::
             vector<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>,_std::allocator<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>_>_>
             ::operator[](&(this->super_ASTNodeBasic).children_,0);
    pAVar4 = std::
             unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>::
             operator->(pvVar3);
    (*pAVar4->_vptr_ASTNodeBasic[5])(pAVar4,scope,out);
  }
  else {
    pvVar3 = std::
             vector<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>,_std::allocator<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>_>_>
             ::operator[](&(this->super_ASTNodeBasic).children_,1);
    pAVar4 = std::
             unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>::
             operator->(pvVar3);
    (*pAVar4->_vptr_ASTNodeBasic[5])(pAVar4,scope,out);
    pvVar3 = std::
             vector<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>,_std::allocator<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>_>_>
             ::operator[](&(this->super_ASTNodeBasic).children_,0);
    pAVar4 = std::
             unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>::
             get(pvVar3);
    if (pAVar4 == (pointer)0x0) {
      local_40 = (ASTTokenBasic *)0x0;
    }
    else {
      local_40 = (ASTTokenBasic *)
                 __dynamic_cast(pAVar4,&ASTNodeBasic::typeinfo,&ASTTokenBasic::typeinfo,0);
    }
    name = ASTTokenBasic::GetStr_abi_cxx11_(local_40);
    vpl::Scope::LoadVariableAddr(scope,name);
    poVar5 = std::operator<<(out,"    pop %");
    iVar1 = vpl::Scope::AssignRegister(scope);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar1);
    std::operator<<(poVar5,'\n');
    vpl::Scope::Pop(scope);
    std::operator<<(out,"    dup\n");
    poVar5 = std::operator<<(out,"    pop !");
    iVar1 = vpl::Scope::AssignRegister(scope);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar1);
    std::operator<<(poVar5,'\n');
  }
  return;
}

Assistant:

virtual void BuildProgram(vpl::Scope* scope, std::ostream& out) const override {
                if (children_.size() == 1) {
                    children_[0]->BuildProgram(scope, out);
                    return;
                }
                children_[1]->BuildProgram(scope, out);
                scope->LoadVariableAddr(GET_TOKEN_STRING(children_[0]));
                out << "    pop %" << scope->AssignRegister() << '\n';
                scope->Pop();
                out << "    dup\n";
                out << "    pop !" << scope->AssignRegister() << '\n';
            }